

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer_world.cpp
# Opt level: O0

ItemSource * __thiscall RandomizerWorld::item_source(RandomizerWorld *this,string *name)

{
  ItemSource *this_00;
  bool bVar1;
  __type _Var2;
  reference ppIVar3;
  string *__lhs;
  out_of_range *this_01;
  ItemSource *source;
  const_iterator __end1;
  const_iterator __begin1;
  vector<ItemSource_*,_std::allocator<ItemSource_*>_> *__range1;
  string *name_local;
  RandomizerWorld *this_local;
  
  __end1 = std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>::begin(&this->_item_sources);
  source = (ItemSource *)
           std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>::end(&this->_item_sources);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<ItemSource_*const_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>
                      (&__end1,(__normal_iterator<ItemSource_*const_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>
                                *)&source);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      this_01 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(this_01,"No source with given name");
      __cxa_throw(this_01,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    ppIVar3 = __gnu_cxx::
              __normal_iterator<ItemSource_*const_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>
              ::operator*(&__end1);
    this_00 = *ppIVar3;
    __lhs = ItemSource::name_abi_cxx11_(this_00);
    _Var2 = std::operator==(__lhs,name);
    if (_Var2) break;
    __gnu_cxx::
    __normal_iterator<ItemSource_*const_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>
    ::operator++(&__end1);
  }
  return this_00;
}

Assistant:

ItemSource* RandomizerWorld::item_source(const std::string& name) const
{
    for (ItemSource* source : _item_sources)
        if (source->name() == name)
            return source;

    throw std::out_of_range("No source with given name");
}